

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::Finalize(FunctionBody *this,bool isShutdown)

{
  bool bVar1;
  uint sourceContextId;
  LocalFunctionId functionId;
  bool isShutdown_local;
  FunctionBody *this_local;
  
  sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)this);
  functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01ea9f78,LinearScanPhase,sourceContextId,functionId);
  if (bVar1) {
    DumpRegStats(this,this);
  }
  Cleanup(this,isShutdown);
  CleanupSourceInfo(this,isShutdown);
  FunctionProxy::CleanupFunctionProxyCounters((FunctionProxy *)this);
  return;
}

Assistant:

void FunctionBody::Finalize(bool isShutdown)
    {
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.Instrument.IsEnabled(Js::LinearScanPhase, this->GetSourceContextId(), this->GetLocalFunctionId()))
        {
            this->DumpRegStats(this);
        }
#endif
        this->Cleanup(isShutdown);
        this->CleanupSourceInfo(isShutdown);
        this->CleanupFunctionProxyCounters();
    }